

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::add_piece_async
          (torrent *this,piece_index_t piece,vector<char,_std::allocator<char>_> *data,
          add_piece_flags_t flags)

{
  element_type *this_00;
  pointer pcVar1;
  pointer pcVar2;
  int iVar3;
  
  this_00 = (this->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (piece.m_val < (this_00->m_files).m_num_pieces) {
    pcVar1 = (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
    pcVar2 = (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    iVar3 = file_storage::piece_size(&this_00->m_files,piece);
    if ((long)pcVar1 - (long)pcVar2 == (long)iVar3) {
      add_piece(this,piece,
                (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start,flags);
      return;
    }
  }
  return;
}

Assistant:

void torrent::add_piece_async(piece_index_t const piece
		, std::vector<char> data, add_piece_flags_t const flags)
	{
		TORRENT_ASSERT(is_single_thread());

		// make sure the piece index is correct
		if (piece >= torrent_file().end_piece())
			return;

		// make sure the piece size is correct
		if (data.size() != std::size_t(m_torrent_file->piece_size(piece)))
			return;

		add_piece(piece, data.data(), flags);
	}